

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::GreaterThanTest<unsigned_long_long,short>(void)

{
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  lhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  rhs;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  lhs_00;
  bool bVar1;
  uint in_stack_ffffffffffffffc8;
  uint uVar2;
  uint uVar3;
  undefined2 in_stack_ffffffffffffffcc;
  short in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar4;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffde;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar5;
  
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int *)CONCAT26(in_stack_ffffffffffffffce,
                                 CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)));
  rhs.m_int._4_4_ = in_stack_ffffffffffffffe4;
  rhs.m_int._0_4_ = in_stack_ffffffffffffffe0;
  bVar1 = ::operator>(in_stack_ffffffffffffffde.m_int,rhs);
  uVar2 = in_stack_ffffffffffffffc8 & 0xffffff;
  uVar3 = uVar2;
  if (bVar1) {
    uVar5 = 4;
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (int *)(CONCAT26(in_stack_ffffffffffffffce,
                                    CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)) &
                          0xffffffff00ffffff));
    lhs.m_int._4_4_ = in_stack_ffffffffffffffd4;
    lhs.m_int._0_4_ = in_stack_ffffffffffffffd0;
    bVar1 = ::operator>(lhs,in_stack_ffffffffffffffce);
    uVar3 = uVar2 & 0xffffff;
    if (bVar1) {
      uVar4 = 6;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(6,in_stack_ffffffffffffffd0),
                     (int *)(CONCAT26(in_stack_ffffffffffffffce,
                                      CONCAT24(in_stack_ffffffffffffffcc,uVar2)) &
                            0xffffffff00ffffff));
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT44(uVar4,in_stack_ffffffffffffffd0),(int *)(ulong)CONCAT24(7,uVar3));
      lhs_00.m_int._4_4_ = uVar5;
      lhs_00.m_int._0_4_ = in_stack_ffffffffffffffe0;
      bVar1 = ::operator>(lhs_00,in_stack_ffffffffffffffde);
      uVar3 = (uint)bVar1 << 0x18;
    }
  }
  return SUB41(uVar3 >> 0x18,0);
}

Assistant:

SAFEINT_CONSTEXPR11 bool GreaterThanTest()
	{
		return
			(U)2 > SafeInt<T>(3) &&
			SafeInt<T>(4) > (U)5 &&
			SafeInt<T>(6) > SafeInt<U>(7);
	}